

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_intialized_inf(void)

{
  int iVar1;
  secp256k1_fe zinv;
  secp256k1_gej infj3;
  secp256k1_gej infj2;
  secp256k1_gej infj1;
  secp256k1_gej npj;
  secp256k1_gej pj;
  secp256k1_ge p;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  secp256k1_gej *in_stack_fffffffffffffc70;
  secp256k1_ge *in_stack_fffffffffffffca0;
  secp256k1_fe *in_stack_fffffffffffffe48;
  secp256k1_ge *in_stack_fffffffffffffe50;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_gej *in_stack_fffffffffffffe60;
  secp256k1_fe *in_stack_fffffffffffffe78;
  secp256k1_gej *in_stack_fffffffffffffe80;
  secp256k1_gej *in_stack_fffffffffffffe88;
  secp256k1_gej *in_stack_fffffffffffffe90;
  secp256k1_fe *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  
  testutil_random_ge_test(in_stack_fffffffffffffca0);
  secp256k1_gej_set_ge
            (in_stack_fffffffffffffc70,
             (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  secp256k1_gej_neg(in_stack_fffffffffffffc70,
                    (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  secp256k1_gej_add_var
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14239c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf40,"test condition failed: secp256k1_gej_is_infinity(&infj1)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x1423f4);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf41,"test condition failed: secp256k1_fe_is_zero(&infj1.x)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x142450);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf42,"test condition failed: secp256k1_fe_is_zero(&infj1.y)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x1424ac);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf43,"test condition failed: secp256k1_fe_is_zero(&infj1.z)");
    abort();
  }
  secp256k1_gej_add_ge_var
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x142523);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf46,"test condition failed: secp256k1_gej_is_infinity(&infj2)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x14257b);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf47,"test condition failed: secp256k1_fe_is_zero(&infj2.x)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x1425d7);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf48,"test condition failed: secp256k1_fe_is_zero(&infj2.y)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x142633);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf49,"test condition failed: secp256k1_fe_is_zero(&infj2.z)");
    abort();
  }
  secp256k1_fe_set_int(&in_stack_fffffffffffffc70->x,in_stack_fffffffffffffc6c);
  secp256k1_gej_add_zinv_var
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1426b4);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf4d,"test condition failed: secp256k1_gej_is_infinity(&infj3)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x142709);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf4e,"test condition failed: secp256k1_fe_is_zero(&infj3.x)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x142762);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf4f,"test condition failed: secp256k1_fe_is_zero(&infj3.y)");
    abort();
  }
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x1427bb);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xf50,"test condition failed: secp256k1_fe_is_zero(&infj3.z)");
    abort();
  }
  return;
}

Assistant:

static void test_intialized_inf(void) {
    secp256k1_ge p;
    secp256k1_gej pj, npj, infj1, infj2, infj3;
    secp256k1_fe zinv;

    /* Test that adding P+(-P) results in a fully initialized infinity*/
    testutil_random_ge_test(&p);
    secp256k1_gej_set_ge(&pj, &p);
    secp256k1_gej_neg(&npj, &pj);

    secp256k1_gej_add_var(&infj1, &pj, &npj, NULL);
    CHECK(secp256k1_gej_is_infinity(&infj1));
    CHECK(secp256k1_fe_is_zero(&infj1.x));
    CHECK(secp256k1_fe_is_zero(&infj1.y));
    CHECK(secp256k1_fe_is_zero(&infj1.z));

    secp256k1_gej_add_ge_var(&infj2, &npj, &p, NULL);
    CHECK(secp256k1_gej_is_infinity(&infj2));
    CHECK(secp256k1_fe_is_zero(&infj2.x));
    CHECK(secp256k1_fe_is_zero(&infj2.y));
    CHECK(secp256k1_fe_is_zero(&infj2.z));

    secp256k1_fe_set_int(&zinv, 1);
    secp256k1_gej_add_zinv_var(&infj3, &npj, &p, &zinv);
    CHECK(secp256k1_gej_is_infinity(&infj3));
    CHECK(secp256k1_fe_is_zero(&infj3.x));
    CHECK(secp256k1_fe_is_zero(&infj3.y));
    CHECK(secp256k1_fe_is_zero(&infj3.z));


}